

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_unlink_internal(lyd_node *node,int permanent)

{
  lyd_node *plVar1;
  lyd_node *plVar2;
  lyd_node *plVar3;
  int iVar4;
  lyd_node *plVar5;
  lyd_node *orig_parent;
  
  if (node == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_unlink_internal");
    iVar4 = 1;
  }
  else {
    if (permanent != 0) {
      check_leaf_list_backlinks(node,1);
    }
    plVar1 = node->next;
    plVar2 = node->prev;
    if (plVar2->next != (lyd_node *)0x0) {
      plVar2->next = plVar1;
    }
    if (plVar1 == (lyd_node *)0x0) {
      orig_parent = node->parent;
      plVar3 = plVar2;
      if (orig_parent == (lyd_node *)0x0) {
        do {
          plVar5 = plVar3;
          plVar3 = plVar5->prev;
        } while (plVar5->prev != node);
      }
      else {
        plVar5 = orig_parent->child;
      }
      plVar5->prev = plVar2;
    }
    else {
      plVar1->prev = plVar2;
      orig_parent = node->parent;
    }
    if (orig_parent != (lyd_node *)0x0) {
      if (orig_parent->child == node) {
        orig_parent->child = plVar1;
      }
      if (permanent != 2) {
        lyd_unlink_hash(node,orig_parent);
      }
      node->parent = (lyd_node *)0x0;
    }
    node->next = (lyd_node *)0x0;
    node->prev = node;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
lyd_unlink_internal(struct lyd_node *node, int permanent)
{
    struct lyd_node *iter;

    if (!node) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (permanent) {
        check_leaf_list_backlinks(node, 1);
    }

    /* unlink from siblings */
    if (node->prev->next) {
        node->prev->next = node->next;
    }
    if (node->next) {
        node->next->prev = node->prev;
    } else {
        /* unlinking the last node */
        if (node->parent) {
            iter = node->parent->child;
        } else {
            iter = node->prev;
            while (iter->prev != node) {
                iter = iter->prev;
            }
        }
        /* update the "last" pointer from the first node */
        iter->prev = node->prev;
    }

    /* unlink from parent */
    if (node->parent) {
        if (node->parent->child == node) {
            /* the node is the first child */
            node->parent->child = node->next;
        }

#ifdef LY_ENABLED_CACHE
        /* do not remove from parent hash table if freeing the whole subtree */
        if (permanent != 2) {
            lyd_unlink_hash(node, node->parent);
        }
#endif

        node->parent = NULL;
    }

    node->next = NULL;
    node->prev = node;

    return EXIT_SUCCESS;
}